

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O3

PHYSFS_Io * doOpen(void *opaque,char *name,int mode)

{
  PHYSFS_ErrorCode errcode;
  size_t sVar1;
  size_t sVar2;
  char *buf;
  PHYSFS_Io *pPVar3;
  undefined1 *puVar4;
  undefined1 *ptr;
  ulong len;
  undefined1 local_58 [8];
  PHYSFS_Stat statbuf;
  
  puVar4 = local_58;
  if (opaque == (void *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen((char *)opaque);
  }
  sVar2 = strlen(name);
  len = sVar2 + sVar1 + 1;
  if (len < 0x100) {
    puVar4 = local_58 + -(sVar2 + sVar1 + 0x18 & 0xfffffffffffffff0);
    ptr = puVar4;
  }
  else {
    ptr = (undefined1 *)0x0;
  }
  *(undefined8 *)(puVar4 + -8) = 0x10ca26;
  buf = (char *)__PHYSFS_initSmallAlloc(ptr,len);
  *(undefined8 *)(puVar4 + -8) = 0x10ca3a;
  cvtToDependent((char *)opaque,name,buf,len);
  if (buf == (char *)0x0) {
    pPVar3 = (PHYSFS_Io *)0x0;
  }
  else {
    *(undefined8 *)(puVar4 + -8) = 0x10ca49;
    pPVar3 = __PHYSFS_createNativeIo(buf,mode);
    if (pPVar3 == (PHYSFS_Io *)0x0) {
      *(undefined8 *)(puVar4 + -8) = 0x10ca56;
      errcode = PHYSFS_getLastErrorCode();
      *(undefined8 *)(puVar4 + -8) = 0x10ca67;
      __PHYSFS_platformStat(buf,(PHYSFS_Stat *)local_58,0);
      *(undefined8 *)(puVar4 + -8) = 0x10ca6f;
      PHYSFS_setErrorCode(errcode);
    }
    *(undefined8 *)(puVar4 + -8) = 0x10ca77;
    __PHYSFS_smallFree(buf);
  }
  return pPVar3;
}

Assistant:

static PHYSFS_Io *doOpen(void *opaque, const char *name, const int mode)
{
    PHYSFS_Io *io = NULL;
    char *f = NULL;

    CVT_TO_DEPENDENT(f, opaque, name);
    BAIL_IF_ERRPASS(!f, NULL);

    io = __PHYSFS_createNativeIo(f, mode);
    if (io == NULL)
    {
        const PHYSFS_ErrorCode err = PHYSFS_getLastErrorCode();
        PHYSFS_Stat statbuf;
        __PHYSFS_platformStat(f, &statbuf, 0);  /* !!! FIXME: why are we stating here? */
        PHYSFS_setErrorCode(err);
    } /* if */

    __PHYSFS_smallFree(f);

    return io;
}